

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexUpper<absl::lts_20250127::uint128>(IntDigits *this,uint128 v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = v.lo_;
  lVar3 = 0;
  uVar4 = v.hi_;
  do {
    do {
      lVar2 = lVar3;
      uVar7 = (uint)uVar6;
      uVar6 = uVar6 >> 4 | uVar4 << 0x3c;
      this->storage_[lVar2 + 0x2b] = "0123456789ABCDEF"[uVar7 & 0xf];
      uVar5 = uVar4 >> 4;
      lVar3 = lVar2 + -1;
      bVar1 = 0xf < uVar4;
      uVar4 = uVar5;
    } while (bVar1);
  } while (uVar6 != 0);
  this->start_ = this->storage_ + lVar2 + 0x2b;
  this->size_ = -lVar3;
  return;
}

Assistant:

void PrintAsHexUpper(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    // kHexTable is only lowercase, so do it manually for uppercase.
    do {
      *--p = "0123456789ABCDEF"[static_cast<size_t>(v) & 15];
      v >>= 4;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }